

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O1

bool __thiscall ON_Leader::SetPoint2d(ON_Leader *this,int idx,ON_2dPoint point)

{
  ON_2dPoint *pOVar1;
  bool bVar2;
  
  bVar2 = idx < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (bVar2 && -1 < idx) {
    pOVar1 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
    pOVar1[(uint)idx].x = point.x;
    pOVar1[(uint)idx].y = point.y;
    if (this->m_curve != (ON_NurbsCurve *)0x0) {
      (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      this->m_curve = (ON_NurbsCurve *)0x0;
    }
    ON_2dPoint::operator=(&this->m_text_point,&ON_3dPoint::UnsetPoint);
  }
  return bVar2 && -1 < idx;
}

Assistant:

bool ON_Leader::SetPoint2d(int idx, ON_2dPoint point)
{
  if (idx >= 0 && idx < m_points.Count())
  {
    m_points[idx] = point;
    if (nullptr != m_curve)
    {
      delete m_curve;
      m_curve = nullptr;
    }
    InvalidateTextPoint();
    return true;
  }
  return false;
}